

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TArray<ASpecialSpot_*,_ASpecialSpot_*>::DoCopy
          (TArray<ASpecialSpot_*,_ASpecialSpot_*> *this,
          TArray<ASpecialSpot_*,_ASpecialSpot_*> *other)

{
  uint uVar1;
  ASpecialSpot **ppAVar2;
  uint local_1c;
  uint i;
  TArray<ASpecialSpot_*,_ASpecialSpot_*> *other_local;
  TArray<ASpecialSpot_*,_ASpecialSpot_*> *this_local;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if (this->Count == 0) {
    this->Array = (ASpecialSpot **)0x0;
  }
  else {
    ppAVar2 = (ASpecialSpot **)
              M_Malloc_Dbg((ulong)this->Most << 3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./tarray.h"
                           ,0x199);
    this->Array = ppAVar2;
    for (local_1c = 0; local_1c < this->Count; local_1c = local_1c + 1) {
      this->Array[local_1c] = other->Array[local_1c];
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}